

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int i;
  int staticsz;
  int dynamicsz;
  uint uVar1;
  char *pcVar2;
  FILE *__stream;
  object *poVar3;
  object *poVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  object *aProcess;
  char imageFileName [120];
  
  puts("Little Smalltalk starting up...");
  builtin_strncpy(imageFileName,"lst.img",8);
  tmpdir = "/tmp";
  prog_argc = argc;
  prog_argv = argv;
  pcVar2 = getenv("TMPDIR");
  if (pcVar2 != (char *)0x0) {
    tmpdir = strdup(pcVar2);
  }
  staticsz = 300000;
  dynamicsz = 300000;
  for (iVar8 = 1; iVar8 < argc; iVar8 = iVar8 + 1) {
    pcVar2 = argv[iVar8];
    if (*pcVar2 == '-') {
      if ((pcVar2[1] == 'v') && (pcVar2[2] == '\0')) {
        puts("Little Smalltalk, version 4.7.2");
      }
      else if ((pcVar2[1] == 's') && (pcVar2[2] == '\0')) {
        staticsz = atoi(argv[(long)iVar8 + 1]);
        iVar8 = iVar8 + 1;
      }
      else if ((pcVar2[1] == 'd') && (pcVar2[2] == '\0')) {
        dynamicsz = atoi(argv[(long)iVar8 + 1]);
        iVar8 = iVar8 + 1;
      }
      else {
        if ((pcVar2[1] != 'g') || (pcVar2[2] != '\0')) goto LAB_001024a7;
        info_impl("main",0x55,"Turning on debugging.");
        debugging = 1;
      }
    }
    else {
LAB_001024a7:
      strcpy(imageFileName,pcVar2);
    }
  }
  info_impl("main",0x60,"Initializing GC memory pool.");
  gcinit(staticsz,dynamicsz);
  info_impl("main",100,"Reading in image from file %s.",imageFileName);
  __stream = fopen(imageFileName,"rb");
  if (__stream == (FILE *)0x0) {
    error_impl("main",0x69,"cannot open image file: %s!",imageFileName);
  }
  uVar1 = fileIn((FILE *)__stream);
  info_impl("main",0x6c,"%d objs/cells in image.",(ulong)uVar1);
  fclose(__stream);
  info_impl("find_initial_method",0xe4,"Finding initial method.");
  info_impl("find_initial_method",0xe6,"Checking for web IDE.");
  poVar3 = lookupGlobal("WebIDE");
  if (poVar3 == (object *)0x0) {
    info_impl("find_initial_method",0xf4,"Checking for commandline REPL.");
    poVar3 = lookupGlobal("REPL");
    if (poVar3 != (object *)0x0) {
      initialMethod = dictLookup((object *)poVar3[2].header,"start");
      if (initialMethod == (object *)0x0) {
        error_impl("find_initial_method",0xfa,"Unable to find method #start in REPL class!");
      }
      pcVar2 = "Found #start method in REPL class.";
      iVar8 = 0xfd;
      goto LAB_001026ba;
    }
    error_impl("find_initial_method",0x102,"Unable to find start up class!");
  }
  else {
    initialMethod = dictLookup((object *)poVar3[2].header,"start");
    if (initialMethod == (object *)0x0) {
      error_impl("find_initial_method",0xec,"Unable to find method #start in WebIDE class!");
    }
    pcVar2 = "Found #start method in WebIDE class.";
    iVar8 = 0xef;
LAB_001026ba:
    info_impl("find_initial_method",iVar8,pcVar2);
  }
  addStaticRoot(&initialMethod);
  if (debugging != 0) {
    dumpMethod(initialMethod,0);
  }
  info_impl("main",0x7a,"Setting up root process.");
  poVar3 = (object *)&memoryPointer[-3].class;
  memoryPointer = poVar3;
  if ((long)poVar3 < (long)memoryBase) {
    poVar3 = gcollect(3);
  }
  else {
    *(object **)poVar3 = (object *)0xc;
  }
  aProcess = poVar3;
  poVar4 = lookupGlobal("Process");
  poVar3->class = poVar4;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    (&poVar3[1].header)[lVar5] = (uintptr_t)nilObject;
  }
  addStaticRoot(&aProcess);
  info_impl("main",0x83,"Setting up root context.");
  poVar3 = (object *)&memoryPointer[-5].class;
  memoryPointer = poVar3;
  if ((long)poVar3 < (long)memoryBase) {
    poVar3 = gcollect(7);
  }
  else {
    *(object **)poVar3 = (object *)0x1c;
  }
  poVar3->class = ContextClass;
  for (lVar5 = 2; lVar5 != 9; lVar5 = lVar5 + 1) {
    (&poVar3->header)[lVar5] = (uintptr_t)nilObject;
  }
  aProcess[1].header = (uintptr_t)poVar3;
  uVar9 = (ulong)initialMethod[2].class >> 1;
  iVar8 = (int)uVar9;
  poVar4 = (object *)((long)&memoryPointer->header + (long)(iVar8 * -8 + -0x10));
  memoryPointer = poVar4;
  if ((long)poVar4 < (long)memoryBase) {
    poVar4 = gcollect(iVar8);
  }
  else {
    poVar4->header = (ulong)(uint)(iVar8 << 2);
  }
  poVar3[2].class = poVar4;
  poVar4->class = ArrayClass;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < iVar8) {
    uVar7 = uVar9 & 0xffffffff;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    (&poVar3[2].class[1].header)[uVar6] = (uintptr_t)nilObject;
  }
  poVar3[1].class = nilObject;
  poVar4 = (object *)&memoryPointer[-0xb].class;
  memoryPointer = poVar4;
  if ((long)poVar4 < (long)memoryBase) {
    poVar4 = gcollect(0x13);
  }
  else {
    *(object **)poVar4 = (object *)0x4c;
  }
  poVar3[2].header = (uintptr_t)poVar4;
  poVar4->class = ArrayClass;
  for (lVar5 = 2; lVar5 != 0x15; lVar5 = lVar5 + 1) {
    *(object **)(poVar3[2].header + lVar5 * 8) = nilObject;
  }
  poVar3[3].header = 1;
  poVar3[3].class = (object *)0x1;
  poVar3[4].header = (uintptr_t)nilObject;
  poVar3[1].header = (uintptr_t)initialMethod;
  lVar5 = (long)rootTop;
  rootTop = rootTop + 1;
  rootStack[lVar5] = aProcess;
  info_impl("main",0xae,"Starting execution.");
  iVar8 = execute(aProcess,0);
  switch(iVar8) {
  case 2:
    pcVar2 = "User defined return";
    break;
  case 3:
    puts("can\'t find method in call");
    lVar5 = (long)rootTop;
    rootTop = rootTop + -1;
    aProcess = (&oldTop)[lVar5];
    printf("Unknown method: %s\n",aProcess[2].header + 0x10);
    backTrace((object *)aProcess[1].header);
    goto LAB_00102985;
  case 4:
    pcVar2 = "normal return";
    break;
  case 5:
    pcVar2 = "time out";
    break;
  default:
    pcVar2 = "unknown return code";
  }
  puts(pcVar2);
LAB_00102985:
  if (cache_miss + cache_hit != 0 && SCARRY8(cache_miss,cache_hit) == cache_miss + cache_hit < 0) {
    puts("\nCache statistics:");
    printf("  %ld hit, %ld miss for %02.2f%% hit rate.\n",
           (double)(float)(((double)cache_hit * 100.0) / (double)(cache_miss + cache_hit)));
  }
  puts("\nGC statistics:");
  printf("  %ld garbage collections\n",gc_count);
  if (0 < gc_count) {
    printf("  %ld total microseconds in GC for %ld microseconds per GC pass.\n",gc_total_time,
           gc_total_time / gc_count);
    printf("  %ld microseconds for longest GC pause.\n",gc_max_time);
    printf("  %ld total bytes copied for %ld bytes per GC on average.\n",gc_total_mem_copied,
           gc_total_mem_copied / gc_count);
    printf("  %ld maximum bytes copied during GC.\n",gc_mem_max_copied);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    struct object *aProcess, *aContext, *o;
    int size, i, staticSize, dynamicSize;
    FILE *fp;
    char imageFileName[120], *p;

    printf("Little Smalltalk starting up...\n");

    prog_argc = argc;
    prog_argv = (const char **)argv;

    strcpy(imageFileName, DefaultImageFile);
    staticSize = DefaultStaticSize;
    dynamicSize = DefaultDynamicSize;
    tmpdir = DefaultTmpdir;

    /*
     * See if our environment tells us what TMPDIR to use
     */
    p = getenv("TMPDIR");
    if (p) {
        tmpdir = strdup(p);
    }

    /* first parse arguments */
    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            /* FIXME - this should be generated by CMake. */
            printf("Little Smalltalk, version " VERSION_STRING "\n");
        } else if (strcmp(argv[i], "-s") == 0) {
            staticSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-d") == 0) {
            dynamicSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-g") == 0) {
            info("Turning on debugging.");
            debugging = 1;
        } else {
            strcpy(imageFileName, argv[i]);
        }
    }

# ifdef COUNTTEMPS
    tempFile = fopen("/usr/tmp/counts", "w");
# endif

    info("Initializing GC memory pool.");

    gcinit(staticSize, dynamicSize);

    info("Reading in image from file %s.", imageFileName);

    /* read in the method from the image file */
    fp = fopen(imageFileName, "rb");
    if (! fp) {
        error("cannot open image file: %s!", imageFileName);
    }

    info("%d objs/cells in image.", fileIn(fp));
    fclose(fp);

    /* find the initial method. */
    find_initial_method();
    addStaticRoot(&initialMethod);

    if(debugging) {
        /* dump startup method */
        dumpMethod(initialMethod, 0);
    }

    /* build the root process with a context, make sure it is GC-proof */

    info("Setting up root process.");

    aProcess = gcalloc(processSize);
    aProcess->class = lookupGlobal("Process");
    for(int i=0; i< processSize; i++) {
        aProcess->data[i] = nilObject;
    }
    addStaticRoot(&aProcess);

    info("Setting up root context.");

    /* context should be dynamic */
    aContext = gcalloc(contextSize);
    aContext->class = ContextClass;
    for(int i=0; i< contextSize; i++) {
        aContext->data[i] = nilObject;
    }

    /* add the context to the process. */
    aProcess->data[contextInProcess] = aContext;

    /* set up context stack */
    size = integerValue(initialMethod->data[stackSizeInMethod]);
    aContext->data[stackInContext] = gcalloc(size);
    aContext->data[stackInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[stackInContext]->data[i] = nilObject;
    }

    /* set up arguments, none. */
    aContext->data[argumentsInContext] = nilObject;

    /* set up temporary array. */
    size = 19;  /* where is this number from? */
    aContext->data[temporariesInContext] = gcalloc(size);
    aContext->data[temporariesInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[temporariesInContext]->data[i] = nilObject;
    }

    aContext->data[bytePointerInContext] = newInteger(0);
    aContext->data[stackTopInContext] = newInteger(0);
    aContext->data[previousContextInContext] = nilObject;
    aContext->data[methodInContext] = initialMethod;

    /* now go do it */
    rootStack[rootTop++] = aProcess;

#if defined(PROFILE)
    take_samples(1);
#endif

    info("Starting execution.");

    switch(execute(aProcess, 0)) {
    case 2:
        printf("User defined return\n");
        break;

    case 3:
        printf("can't find method in call\n");
        aProcess = rootStack[--rootTop];
        o = aProcess->data[resultInProcess];
        printf("Unknown method: %s\n", bytePtr(o));
        aContext = aProcess->data[contextInProcess];
        backTrace(aContext);
        break;

    case 4:
        printf("normal return\n");
        break;

    case 5:
        printf("time out\n");
        break;

    default:
        printf("unknown return code\n");
        break;
    }
#if defined(VSTA) && defined(PROFILE)
    dump_samples();
#endif

    if((cache_hit + cache_miss) > 0) {
        printf("\nCache statistics:\n");
        printf("  %" PRId64 " hit, %" PRId64 " miss for %02.2f%% hit rate.\n", cache_hit, cache_miss, (float)((float)(cache_hit)*100.0/(float)(cache_hit + cache_miss)));
    }

    printf("\nGC statistics:\n");
    printf("  %" PRId64 " garbage collections\n", gc_count);
    if(gc_count > 0) {
        printf("  %" PRId64 " total microseconds in GC for %" PRId64 " microseconds per GC pass.\n", gc_total_time, gc_total_time/gc_count);
        printf("  %" PRId64 " microseconds for longest GC pause.\n", gc_max_time);
        printf("  %" PRId64 " total bytes copied for %" PRId64 " bytes per GC on average.\n", gc_total_mem_copied, gc_total_mem_copied/gc_count);
        printf("  %" PRId64 " maximum bytes copied during GC.\n", gc_mem_max_copied);
    }

    return(0);
}